

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer-CH.cc
# Opt level: O0

void normalize_digital_lower(string *line)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong in_RDI;
  uint i;
  uint local_c;
  
  for (local_c = 0; uVar2 = std::__cxx11::string::size(), local_c < uVar2; local_c = local_c + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    if ((*pcVar3 < '0') ||
       (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), '9' < *pcVar3)) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (('@' < *pcVar3) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 < '[')) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
        cVar1 = *pcVar3;
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
        *pcVar3 = cVar1 + ' ';
      }
    }
    else {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
      *puVar4 = 0x30;
    }
  }
  return;
}

Assistant:

void normalize_digital_lower(string& line){
  for(unsigned i = 0; i < line.size(); i ++){
    if(line[i] >= '0' && line[i] <= '9'){
      line[i] = '0';
    }
    else if(line[i] >= 'A' && line[i] <= 'Z'){
      line[i] = line[i] - 'A' + 'a';
    }
  }
}